

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Glucose::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  ClauseAllocator *this_00;
  uint *puVar1;
  bool bVar2;
  VarData *pVVar3;
  int iVar4;
  long lVar5;
  vec<Glucose::Solver::Watcher> *pvVar6;
  int i_1;
  ulong uVar7;
  ulong uVar8;
  int j;
  long lVar9;
  int i;
  long lVar10;
  
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->watches);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->watchesBin);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->unaryWatches);
  this_00 = &this->ca;
  for (lVar5 = 0; lVar5 < (this->vardata).sz; lVar5 = lVar5 + 1) {
    for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
      uVar7 = uVar8 | lVar5 * 2;
      pvVar6 = (this->watches).occs.data + uVar7;
      lVar10 = 0;
      for (lVar9 = 0; lVar9 < pvVar6->sz; lVar9 = lVar9 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar6->data->cref + lVar10),to);
        lVar10 = lVar10 + 8;
      }
      pvVar6 = (this->watchesBin).occs.data + uVar7;
      lVar10 = 0;
      for (lVar9 = 0; lVar9 < pvVar6->sz; lVar9 = lVar9 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar6->data->cref + lVar10),to);
        lVar10 = lVar10 + 8;
      }
      pvVar6 = (this->unaryWatches).occs.data + uVar7;
      lVar10 = 0;
      for (lVar9 = 0; lVar9 < pvVar6->sz; lVar9 = lVar9 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar6->data->cref + lVar10),to);
        lVar10 = lVar10 + 8;
      }
    }
  }
  lVar5 = 0;
  do {
    if ((this->trail).sz <= lVar5) {
      lVar9 = 0;
      for (lVar5 = 0; lVar5 < (this->learnts).sz; lVar5 = lVar5 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)(this->learnts).data + lVar9),to);
        lVar9 = lVar9 + 4;
      }
      lVar9 = 0;
      for (lVar5 = 0; lVar5 < (this->permanentLearnts).sz; lVar5 = lVar5 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)(this->permanentLearnts).data + lVar9),to);
        lVar9 = lVar9 + 4;
      }
      lVar9 = 0;
      for (lVar5 = 0; lVar5 < (this->clauses).sz; lVar5 = lVar5 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)(this->clauses).data + lVar9),to);
        lVar9 = lVar9 + 4;
      }
      lVar9 = 0;
      for (lVar5 = 0; lVar5 < (this->unaryWatchedClauses).sz; lVar5 = lVar5 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)(this->unaryWatchedClauses).data + lVar9),to);
        lVar9 = lVar9 + 4;
      }
      return;
    }
    pVVar3 = (this->vardata).data;
    iVar4 = (this->trail).data[lVar5].x >> 1;
    uVar8 = (ulong)pVVar3[iVar4].reason;
    if (uVar8 != 0xffffffff) {
      puVar1 = (this_00->super_RegionAllocator<unsigned_int>).memory;
      if ((puVar1[uVar8] & 0x80) == 0) {
        bVar2 = locked(this,(Clause *)(puVar1 + uVar8));
        if (!bVar2) goto LAB_0010f1ad;
        pVVar3 = (this->vardata).data;
      }
      ClauseAllocator::reloc(this_00,&pVVar3[iVar4].reason,to);
    }
LAB_0010f1ad:
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void Solver::relocAll(ClauseAllocator &to) {
    // All watchers:
    // for (int i = 0; i < watches.size(); i++)
    watches.cleanAll();
    watchesBin.cleanAll();
    unaryWatches.cleanAll();
    for(int v = 0; v < nVars(); v++)
        for(int s = 0; s < 2; s++) {
            Lit p = mkLit(v, s);
            // printf(" >>> RELOCING: %s%d\n", sign(p)?"-":"", var(p)+1);
            vec <Watcher> &ws = watches[p];
            for(int j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
            vec <Watcher> &ws2 = watchesBin[p];
            for(int j = 0; j < ws2.size(); j++)
                ca.reloc(ws2[j].cref, to);
            vec <Watcher> &ws3 = unaryWatches[p];
            for(int j = 0; j < ws3.size(); j++)
                ca.reloc(ws3[j].cref, to);
        }

    // All reasons:
    //
    for(int i = 0; i < trail.size(); i++) {
        Var v = var(trail[i]);

        if(reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)])))
            ca.reloc(vardata[v].reason, to);
    }

    // All learnt:
    //
    for(int i = 0; i < learnts.size(); i++)
        ca.reloc(learnts[i], to);

    for(int i = 0; i < permanentLearnts.size(); i++)
        ca.reloc(permanentLearnts[i], to);

    // All original:
    //
    for(int i = 0; i < clauses.size(); i++)
        ca.reloc(clauses[i], to);

    for(int i = 0; i < unaryWatchedClauses.size(); i++)
        ca.reloc(unaryWatchedClauses[i], to);
}